

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# voc.c
# Opt level: O0

void voc_iterate(voccxdef *ctx,objnum objn,_func_void_void_ptr_vocdef_ptr_vocwdef_ptr *fn,
                void *fnctx)

{
  uint uVar1;
  undefined8 in_RCX;
  code *in_RDX;
  short in_SI;
  long in_RDI;
  uint idx;
  vocwdef *vw;
  vocdef **vp;
  vocdef *v;
  int i;
  uint *local_68;
  uint *local_50;
  uint *local_40;
  undefined8 *local_38;
  undefined8 *local_30;
  int local_24;
  
  local_38 = (undefined8 *)(in_RDI + 0x670);
  for (local_24 = 0x100; local_24 != 0; local_24 = local_24 + -1) {
    for (local_30 = (undefined8 *)*local_38; local_30 != (undefined8 *)0x0;
        local_30 = (undefined8 *)*local_30) {
      uVar1 = *(uint *)((long)local_30 + 0xc);
      if (uVar1 == 0xffffffff) {
        local_50 = (uint *)0x0;
      }
      else {
        local_50 = (uint *)(*(long *)(in_RDI + 0xe70 + ((ulong)uVar1 / 2000) * 8) +
                           ((ulong)uVar1 % 2000) * 8);
      }
      local_40 = local_50;
      while (local_40 != (uint *)0x0) {
        if ((in_SI == -1) || ((short)local_40[1] == in_SI)) {
          (*in_RDX)(in_RCX,local_30,local_40);
        }
        uVar1 = *local_40;
        if (uVar1 == 0xffffffff) {
          local_68 = (uint *)0x0;
        }
        else {
          local_68 = (uint *)(*(long *)(in_RDI + 0xe70 + ((ulong)uVar1 / 2000) * 8) +
                             ((ulong)uVar1 % 2000) * 8);
        }
        local_40 = local_68;
      }
    }
    local_38 = local_38 + 1;
  }
  return;
}

Assistant:

void voc_iterate(voccxdef *ctx, objnum objn,
                 void (*fn)(void *, vocdef *, vocwdef *), void *fnctx)
{
    int       i;
    vocdef   *v;
    vocdef  **vp;
    vocwdef  *vw;
    uint      idx;

    /* go through each hash value looking for matching words */
    for (i = VOCHASHSIZ, vp = ctx->voccxhsh ; i ; ++vp, --i)
    {
        /* go through all words in this hash chain */
        for (v = *vp ; v ; v = v->vocnxt)
        {
            /* go through each object relation for this word */
            for (idx = v->vocwlst, vw = vocwget(ctx, idx) ; vw ;
                 idx = vw->vocwnxt, vw = vocwget(ctx, idx))
            {
                /*
                 *   if this word is for this object, call the callback
                 */
                if (objn == MCMONINV || vw->vocwobj == objn)
                    (*fn)(fnctx, v, vw);
            }
        }
    }
}